

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O2

size_t openMerkleTreeSize(size_t numNodes,uint16_t *missingLeaves,size_t missingLeavesSize,
                         picnic_instance_t *params)

{
  _Bool _Var1;
  uint *__ptr;
  size_t sVar2;
  size_t revealedSize;
  tree_t tree;
  
  _Var1 = createTree(&tree,(uint)numNodes,(uint)params->digest_size);
  if (_Var1) {
    revealedSize = 0;
    __ptr = getRevealedMerkleNodes(&tree,missingLeaves,missingLeavesSize,&revealedSize);
    clearTree(&tree);
    free(__ptr);
    sVar2 = params->digest_size * revealedSize;
  }
  else {
    sVar2 = 0xffffffffffffffff;
  }
  return sVar2;
}

Assistant:

size_t openMerkleTreeSize(size_t numNodes, uint16_t* missingLeaves, size_t missingLeavesSize,
                          const picnic_instance_t* params) {
  tree_t tree;
  if (!createTree(&tree, numNodes, params->digest_size)) {
    return SIZE_MAX;
  }

  size_t revealedSize = 0;
  unsigned int* revealed =
      getRevealedMerkleNodes(&tree, missingLeaves, missingLeavesSize, &revealedSize);

  clearTree(&tree);
  free(revealed);

  return revealedSize * params->digest_size;
}